

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O2

Animation __thiscall
DataSourceBase::get_animation(DataSourceBase *this,size_t animation,size_t phase)

{
  pointer pvVar1;
  long lVar2;
  Stream *pSVar3;
  undefined8 uVar4;
  int iVar5;
  Animation AVar6;
  allocator<char> local_59;
  undefined1 local_58 [8];
  size_t animation_local;
  _Alloc_hider local_48;
  size_type local_40;
  string local_38 [32];
  
  local_48._M_p = (pointer)(phase >> 3);
  pvVar1 = (this->animation_table).
           super__Vector_base<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((animation <
       (ulong)(((long)(this->animation_table).
                      super__Vector_base<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18)) &&
     (lVar2 = *(long *)&pvVar1[animation].
                        super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>.
                        _M_impl.super__Vector_impl_data,
     local_48._M_p <
     (pointer)(((long)*(pointer *)
                       ((long)&pvVar1[animation].
                               super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>
                               ._M_impl.super__Vector_impl_data + 8) - lVar2) / 0xc))) {
    uVar4 = *(undefined8 *)(lVar2 + (long)local_48._M_p * 0xc);
    iVar5 = *(int *)(lVar2 + 8 + (long)local_48._M_p * 0xc);
  }
  else {
    animation_local = animation;
    std::__cxx11::string::string<std::allocator<char>>(local_38,"data",&local_59);
    Log::Logger::operator[]((Logger *)local_58,(string *)&Log::Error);
    pSVar3 = Log::Stream::operator<<((Stream *)local_58,"Failed to get animation #");
    pSVar3 = Log::Stream::operator<<(pSVar3,&animation_local);
    pSVar3 = Log::Stream::operator<<(pSVar3," phase #");
    pSVar3 = Log::Stream::operator<<(pSVar3,(unsigned_long *)&local_48);
    pSVar3 = Log::Stream::operator<<(pSVar3," (got only ");
    pvVar1 = (this->animation_table).
             super__Vector_base<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_40 = ((long)*(pointer *)
                       ((long)&pvVar1[animation_local].
                               super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>
                               ._M_impl.super__Vector_impl_data + 8) -
               *(long *)&pvVar1[animation_local].
                         super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>.
                         _M_impl.super__Vector_impl_data) / 0xc;
    pSVar3 = Log::Stream::operator<<(pSVar3,&local_40);
    Log::Stream::operator<<(pSVar3," phases)");
    Log::Stream::~Stream((Stream *)local_58);
    std::__cxx11::string::~string(local_38);
    iVar5 = 0;
    uVar4 = 0;
  }
  AVar6.y = iVar5;
  AVar6.sprite = (char)uVar4;
  AVar6._1_3_ = (int3)((ulong)uVar4 >> 8);
  AVar6.x = (int)((ulong)uVar4 >> 0x20);
  return AVar6;
}

Assistant:

Data::Animation
DataSourceBase::get_animation(size_t animation, size_t phase) {
  phase >>= 3;
  if ((animation >= animation_table.size()) ||
      (phase >= animation_table[animation].size())) {
    Log::Error["data"] << "Failed to get animation #" << animation
    << " phase #" << phase
    << " (got only " << animation_table[animation].size()
    << " phases)";
    return {0, 0, 0};
  }

  return animation_table[animation][phase];
}